

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::UpdateClipRect(ImDrawList *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [11];
  undefined1 auVar8 [11];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  int *in_RDI;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  byte bVar30;
  ImDrawList *unaff_retaddr;
  ImDrawCmd *prev_cmd;
  ImDrawCmd *curr_cmd;
  ImVec4 curr_clip_rect;
  ImVector<ImDrawCmd> *local_58;
  int *local_48;
  int *local_40;
  undefined8 *local_38;
  char local_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char cStack_11;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  char cStack_c;
  char cStack_b;
  char cStack_a;
  char cStack_9;
  
  if (in_RDI[0x18] == 0) {
    local_38 = (undefined8 *)(*(long *)(in_RDI + 0xe) + 0x1c);
  }
  else {
    local_38 = (undefined8 *)(*(long *)(in_RDI + 0x1a) + (long)(in_RDI[0x18] + -1) * 0x10);
  }
  uVar1 = *local_38;
  uVar2 = local_38[1];
  if (*in_RDI < 1) {
    local_40 = (int *)0x0;
  }
  else {
    local_40 = (int *)(*(long *)(in_RDI + 2) + (long)(*in_RDI + -1) * 0x38);
  }
  if (local_40 != (int *)0x0) {
    local_18 = (char)uVar1;
    cStack_17 = (char)((ulong)uVar1 >> 8);
    cStack_16 = (char)((ulong)uVar1 >> 0x10);
    cStack_15 = (char)((ulong)uVar1 >> 0x18);
    cStack_14 = (char)((ulong)uVar1 >> 0x20);
    cStack_13 = (char)((ulong)uVar1 >> 0x28);
    cStack_12 = (char)((ulong)uVar1 >> 0x30);
    cStack_11 = (char)((ulong)uVar1 >> 0x38);
    cStack_10 = (char)uVar2;
    cStack_f = (char)((ulong)uVar2 >> 8);
    cStack_e = (char)((ulong)uVar2 >> 0x10);
    cStack_d = (char)((ulong)uVar2 >> 0x18);
    cStack_c = (char)((ulong)uVar2 >> 0x20);
    cStack_b = (char)((ulong)uVar2 >> 0x28);
    cStack_a = (char)((ulong)uVar2 >> 0x30);
    cStack_9 = (char)((ulong)uVar2 >> 0x38);
    if (*local_40 != 0) {
      cVar15 = -((char)local_40[1] == local_18);
      cVar16 = -(*(char *)((long)local_40 + 5) == cStack_17);
      cVar17 = -(*(char *)((long)local_40 + 6) == cStack_16);
      cVar18 = -(*(char *)((long)local_40 + 7) == cStack_15);
      cVar19 = -((char)local_40[2] == cStack_14);
      cVar20 = -(*(char *)((long)local_40 + 9) == cStack_13);
      cVar21 = -(*(char *)((long)local_40 + 10) == cStack_12);
      cVar22 = -(*(char *)((long)local_40 + 0xb) == cStack_11);
      cVar23 = -((char)local_40[3] == cStack_10);
      cVar24 = -(*(char *)((long)local_40 + 0xd) == cStack_f);
      cVar25 = -(*(char *)((long)local_40 + 0xe) == cStack_e);
      cVar26 = -(*(char *)((long)local_40 + 0xf) == cStack_d);
      cVar27 = -((char)local_40[4] == cStack_c);
      cVar28 = -(*(char *)((long)local_40 + 0x11) == cStack_b);
      cVar29 = -(*(char *)((long)local_40 + 0x12) == cStack_a);
      bVar30 = -(*(char *)((long)local_40 + 0x13) == cStack_9);
      auVar3[1] = cVar16;
      auVar3[0] = cVar15;
      auVar3[2] = cVar17;
      auVar3[3] = cVar18;
      auVar3[4] = cVar19;
      auVar3[5] = cVar20;
      auVar3[6] = cVar21;
      auVar3[7] = cVar22;
      auVar3[8] = cVar23;
      auVar3[9] = cVar24;
      auVar3[10] = cVar25;
      auVar3[0xb] = cVar26;
      auVar3[0xc] = cVar27;
      auVar3[0xd] = cVar28;
      auVar3[0xe] = cVar29;
      auVar3[0xf] = bVar30;
      auVar4[1] = cVar16;
      auVar4[0] = cVar15;
      auVar4[2] = cVar17;
      auVar4[3] = cVar18;
      auVar4[4] = cVar19;
      auVar4[5] = cVar20;
      auVar4[6] = cVar21;
      auVar4[7] = cVar22;
      auVar4[8] = cVar23;
      auVar4[9] = cVar24;
      auVar4[10] = cVar25;
      auVar4[0xb] = cVar26;
      auVar4[0xc] = cVar27;
      auVar4[0xd] = cVar28;
      auVar4[0xe] = cVar29;
      auVar4[0xf] = bVar30;
      auVar13[1] = cVar18;
      auVar13[0] = cVar17;
      auVar13[2] = cVar19;
      auVar13[3] = cVar20;
      auVar13[4] = cVar21;
      auVar13[5] = cVar22;
      auVar13[6] = cVar23;
      auVar13[7] = cVar24;
      auVar13[8] = cVar25;
      auVar13[9] = cVar26;
      auVar13[10] = cVar27;
      auVar13[0xb] = cVar28;
      auVar13[0xc] = cVar29;
      auVar13[0xd] = bVar30;
      auVar11[1] = cVar19;
      auVar11[0] = cVar18;
      auVar11[2] = cVar20;
      auVar11[3] = cVar21;
      auVar11[4] = cVar22;
      auVar11[5] = cVar23;
      auVar11[6] = cVar24;
      auVar11[7] = cVar25;
      auVar11[8] = cVar26;
      auVar11[9] = cVar27;
      auVar11[10] = cVar28;
      auVar11[0xb] = cVar29;
      auVar11[0xc] = bVar30;
      auVar9[1] = cVar20;
      auVar9[0] = cVar19;
      auVar9[2] = cVar21;
      auVar9[3] = cVar22;
      auVar9[4] = cVar23;
      auVar9[5] = cVar24;
      auVar9[6] = cVar25;
      auVar9[7] = cVar26;
      auVar9[8] = cVar27;
      auVar9[9] = cVar28;
      auVar9[10] = cVar29;
      auVar9[0xb] = bVar30;
      auVar7[1] = cVar21;
      auVar7[0] = cVar20;
      auVar7[2] = cVar22;
      auVar7[3] = cVar23;
      auVar7[4] = cVar24;
      auVar7[5] = cVar25;
      auVar7[6] = cVar26;
      auVar7[7] = cVar27;
      auVar7[8] = cVar28;
      auVar7[9] = cVar29;
      auVar7[10] = bVar30;
      if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar13 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar11 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar9 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar7 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar30,CONCAT18(cVar29,CONCAT17(cVar28,CONCAT16(cVar27,
                                                  CONCAT15(cVar26,CONCAT14(cVar25,CONCAT13(cVar24,
                                                  CONCAT12(cVar23,CONCAT11(cVar22,cVar21))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar30,CONCAT17(cVar29,CONCAT16(cVar28,CONCAT15(cVar27,
                                                  CONCAT14(cVar26,CONCAT13(cVar25,CONCAT12(cVar24,
                                                  CONCAT11(cVar23,cVar22)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar30 >> 7) << 0xf) != 0xffff) goto LAB_001fc0a4;
    }
    if (*(long *)(local_40 + 10) == 0) {
      if (*in_RDI < 2) {
        local_48 = (int *)0x0;
      }
      else {
        local_48 = local_40 + -0xe;
      }
      if ((*local_40 == 0) && (local_48 != (int *)0x0)) {
        cVar15 = -((char)local_48[1] == local_18);
        cVar16 = -(*(char *)((long)local_48 + 5) == cStack_17);
        cVar17 = -(*(char *)((long)local_48 + 6) == cStack_16);
        cVar18 = -(*(char *)((long)local_48 + 7) == cStack_15);
        cVar19 = -((char)local_48[2] == cStack_14);
        cVar20 = -(*(char *)((long)local_48 + 9) == cStack_13);
        cVar21 = -(*(char *)((long)local_48 + 10) == cStack_12);
        cVar22 = -(*(char *)((long)local_48 + 0xb) == cStack_11);
        cVar23 = -((char)local_48[3] == cStack_10);
        cVar24 = -(*(char *)((long)local_48 + 0xd) == cStack_f);
        cVar25 = -(*(char *)((long)local_48 + 0xe) == cStack_e);
        cVar26 = -(*(char *)((long)local_48 + 0xf) == cStack_d);
        cVar27 = -((char)local_48[4] == cStack_c);
        cVar28 = -(*(char *)((long)local_48 + 0x11) == cStack_b);
        cVar29 = -(*(char *)((long)local_48 + 0x12) == cStack_a);
        bVar30 = -(*(char *)((long)local_48 + 0x13) == cStack_9);
        auVar5[1] = cVar16;
        auVar5[0] = cVar15;
        auVar5[2] = cVar17;
        auVar5[3] = cVar18;
        auVar5[4] = cVar19;
        auVar5[5] = cVar20;
        auVar5[6] = cVar21;
        auVar5[7] = cVar22;
        auVar5[8] = cVar23;
        auVar5[9] = cVar24;
        auVar5[10] = cVar25;
        auVar5[0xb] = cVar26;
        auVar5[0xc] = cVar27;
        auVar5[0xd] = cVar28;
        auVar5[0xe] = cVar29;
        auVar5[0xf] = bVar30;
        auVar6[1] = cVar16;
        auVar6[0] = cVar15;
        auVar6[2] = cVar17;
        auVar6[3] = cVar18;
        auVar6[4] = cVar19;
        auVar6[5] = cVar20;
        auVar6[6] = cVar21;
        auVar6[7] = cVar22;
        auVar6[8] = cVar23;
        auVar6[9] = cVar24;
        auVar6[10] = cVar25;
        auVar6[0xb] = cVar26;
        auVar6[0xc] = cVar27;
        auVar6[0xd] = cVar28;
        auVar6[0xe] = cVar29;
        auVar6[0xf] = bVar30;
        auVar14[1] = cVar18;
        auVar14[0] = cVar17;
        auVar14[2] = cVar19;
        auVar14[3] = cVar20;
        auVar14[4] = cVar21;
        auVar14[5] = cVar22;
        auVar14[6] = cVar23;
        auVar14[7] = cVar24;
        auVar14[8] = cVar25;
        auVar14[9] = cVar26;
        auVar14[10] = cVar27;
        auVar14[0xb] = cVar28;
        auVar14[0xc] = cVar29;
        auVar14[0xd] = bVar30;
        auVar12[1] = cVar19;
        auVar12[0] = cVar18;
        auVar12[2] = cVar20;
        auVar12[3] = cVar21;
        auVar12[4] = cVar22;
        auVar12[5] = cVar23;
        auVar12[6] = cVar24;
        auVar12[7] = cVar25;
        auVar12[8] = cVar26;
        auVar12[9] = cVar27;
        auVar12[10] = cVar28;
        auVar12[0xb] = cVar29;
        auVar12[0xc] = bVar30;
        auVar10[1] = cVar20;
        auVar10[0] = cVar19;
        auVar10[2] = cVar21;
        auVar10[3] = cVar22;
        auVar10[4] = cVar23;
        auVar10[5] = cVar24;
        auVar10[6] = cVar25;
        auVar10[7] = cVar26;
        auVar10[8] = cVar27;
        auVar10[9] = cVar28;
        auVar10[10] = cVar29;
        auVar10[0xb] = bVar30;
        auVar8[1] = cVar21;
        auVar8[0] = cVar20;
        auVar8[2] = cVar22;
        auVar8[3] = cVar23;
        auVar8[4] = cVar24;
        auVar8[5] = cVar25;
        auVar8[6] = cVar26;
        auVar8[7] = cVar27;
        auVar8[8] = cVar28;
        auVar8[9] = cVar29;
        auVar8[10] = bVar30;
        if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar12 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar8 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar30,CONCAT18(cVar29,CONCAT17(cVar28,CONCAT16(cVar27
                                                  ,CONCAT15(cVar26,CONCAT14(cVar25,CONCAT13(cVar24,
                                                  CONCAT12(cVar23,CONCAT11(cVar22,cVar21))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar30,CONCAT17(cVar29,CONCAT16(cVar28,CONCAT15(cVar27
                                                  ,CONCAT14(cVar26,CONCAT13(cVar25,CONCAT12(cVar24,
                                                  CONCAT11(cVar23,cVar22)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar30 >> 7) << 0xf) == 0xffff) {
          if (in_RDI[0x1c] == 0) {
            local_58 = (ImVector<ImDrawCmd> *)0x0;
          }
          else {
            local_58 = *(ImVector<ImDrawCmd> **)
                        (*(long *)(in_RDI + 0x1e) + (long)(in_RDI[0x1c] + -1) * 8);
          }
          if ((*(ImVector<ImDrawCmd> **)(local_48 + 6) == local_58) &&
             (*(long *)(local_48 + 10) == 0)) {
            ImVector<ImDrawCmd>::pop_back(*(ImVector<ImDrawCmd> **)(local_48 + 6));
            return;
          }
        }
      }
      *(undefined8 *)(local_40 + 1) = uVar1;
      *(undefined8 *)(local_40 + 3) = uVar2;
      return;
    }
  }
LAB_001fc0a4:
  AddDrawCmd(unaff_retaddr);
  return;
}

Assistant:

void ImDrawList::UpdateClipRect()
{
    // If current command is used with different settings we need to add a new command
    const ImVec4 curr_clip_rect = GetCurrentClipRect();
    ImDrawCmd* curr_cmd = CmdBuffer.Size > 0 ? &CmdBuffer.Data[CmdBuffer.Size-1] : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) != 0) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && memcmp(&prev_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) == 0 && prev_cmd->TextureId == GetCurrentTextureId() && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->ClipRect = curr_clip_rect;
}